

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample.cpp
# Opt level: O0

void __thiscall
Person::hibernate<hiberlite::AVisitor<hiberlite::ExtractModel>>
          (Person *this,AVisitor<hiberlite::ExtractModel> *ar)

{
  AVisitor<hiberlite::ExtractModel> *pAVar1;
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [32];
  sql_nvp<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a0;
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [32];
  sql_nvp<double> local_108;
  allocator local_b9;
  string local_b8 [55];
  allocator local_81;
  string local_80 [32];
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_60
  ;
  AVisitor<hiberlite::ExtractModel> *local_18;
  AVisitor<hiberlite::ExtractModel> *ar_local;
  Person *this_local;
  
  local_18 = ar;
  ar_local = (AVisitor<hiberlite::ExtractModel> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"name",&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"",&local_b9);
  hiberlite::
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::sql_nvp
            (&local_60,(string *)local_80,&this->name,(string *)local_b8);
  hiberlite::AVisitor<hiberlite::ExtractModel>::operator&(ar,&local_60);
  hiberlite::
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~sql_nvp(&local_60);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  pAVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"age",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"",&local_151);
  hiberlite::sql_nvp<double>::sql_nvp(&local_108,(string *)local_128,&this->age,(string *)local_150)
  ;
  hiberlite::AVisitor<hiberlite::ExtractModel>::operator&(pAVar1,&local_108);
  hiberlite::sql_nvp<double>::~sql_nvp(&local_108);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  pAVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"bio",&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"",&local_1e9);
  hiberlite::
  sql_nvp<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::sql_nvp(&local_1a0,(string *)local_1c0,&this->bio,(string *)local_1e8);
  hiberlite::AVisitor<hiberlite::ExtractModel>::operator&(pAVar1,&local_1a0);
  hiberlite::
  sql_nvp<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~sql_nvp(&local_1a0);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  return;
}

Assistant:

void hibernate(Archive & ar)
  {
    ar & HIBERLITE_NVP(name);
    ar & HIBERLITE_NVP(age);
    ar & HIBERLITE_NVP(bio);
  }